

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O0

int __thiscall IRCCommand::getAccessLevel(IRCCommand *this,Channel *channel)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  reference pTVar4;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  undefined1 auVar5 [16];
  TypeAccessPair *pair_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_> *__range1_1;
  ChannelAccessPair *pair;
  iterator __end1;
  iterator __begin1;
  vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_> *__range1;
  Channel *channel_local;
  IRCCommand *this_local;
  
  __end1 = std::
           vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
           begin(&this->m_channels);
  pair = (ChannelAccessPair *)
         std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>
         ::end(&this->m_channels);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<IRCCommand::ChannelAccessPair_*,_std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>_>
                      (&__end1,(__normal_iterator<IRCCommand::ChannelAccessPair_*,_std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>_>
                                *)&pair);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __end1_1 = std::
                 vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>::
                 begin(&this->m_types);
      pair_1 = (TypeAccessPair *)
               std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
               ::end(&this->m_types);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<IRCCommand::TypeAccessPair_*,_std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>_>
                          (&__end1_1,
                           (__normal_iterator<IRCCommand::TypeAccessPair_*,_std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>_>
                            *)&pair_1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          return this->m_access;
        }
        pTVar4 = __gnu_cxx::
                 __normal_iterator<IRCCommand::TypeAccessPair_*,_std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>_>
                 ::operator*(&__end1_1);
        iVar1 = pTVar4->type;
        iVar3 = Jupiter::IRC::Client::Channel::getType();
        if (iVar1 == iVar3) break;
        __gnu_cxx::
        __normal_iterator<IRCCommand::TypeAccessPair_*,_std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>_>
        ::operator++(&__end1_1);
      }
      return pTVar4->access;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<IRCCommand::ChannelAccessPair_*,_std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>_>
              ::operator*(&__end1);
    auVar5 = Jupiter::IRC::Client::Channel::getName();
    rhs._M_len = auVar5._8_8_;
    rhs._M_str = in_RCX;
    bVar2 = jessilib::equalsi<char,char>((jessilib *)this_00,auVar5._0_8_,rhs);
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<IRCCommand::ChannelAccessPair_*,_std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>_>
    ::operator++(&__end1);
  }
  return this_00->access;
}

Assistant:

int IRCCommand::getAccessLevel(Jupiter::IRC::Client::Channel *channel) {
	for (const auto& pair : m_channels) {
		if (jessilib::equalsi(pair.channel, channel->getName())) {
			return pair.access;
		}
	}

	for (const auto& pair : m_types) {
		if (pair.type == channel->getType()) {
			return pair.access;
		}
	}

	return m_access;
}